

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FboCases::SharedDepthStencilTest::render
          (SharedDepthStencilTest *this,Context *context,Surface *dst)

{
  FboConfig *config;
  GLenum GVar1;
  ulong uVar2;
  deUint32 program;
  uint uVar3;
  int iVar4;
  uint uVar5;
  DataTypes *samplerTypes;
  TestError *this_00;
  ulong uVar6;
  uint uVar7;
  int in_R9D;
  int iVar8;
  bool bVar9;
  Vector<float,_4> local_3e8;
  Surface *local_3d8;
  Vector<float,_4> local_3d0;
  Framebuffer fboA;
  TextureFormat local_388;
  Framebuffer fboB;
  FboConfig cfg;
  FlatColorShader flatShader;
  Texture2DShader texShader;
  
  flatShader.super_ShaderProgram.super_VertexShader._vptr_VertexShader = (_func_int **)0x0;
  flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  flatShader.super_ShaderProgram.super_VertexShader.m_inputs.
  super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3d8 = dst;
  samplerTypes = FboTestUtil::DataTypes::operator<<((DataTypes *)&flatShader,TYPE_SAMPLER_2D);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&fboA,1.0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&fboB,0.0);
  FboTestUtil::Texture2DShader::Texture2DShader
            (&texShader,samplerTypes,TYPE_FLOAT_VEC4,(Vec4 *)&fboA,(Vec4 *)&fboB);
  std::_Vector_base<glu::DataType,_std::allocator<glu::DataType>_>::~_Vector_base
            ((_Vector_base<glu::DataType,_std::allocator<glu::DataType>_> *)&flatShader);
  FboTestUtil::FlatColorShader::FlatColorShader(&flatShader,TYPE_FLOAT_VEC4);
  program = (*context->_vptr_Context[0x75])(context,&texShader);
  uVar3 = (*context->_vptr_Context[0x75])(context,&flatShader);
  uVar5 = (this->super_FboRenderCase).m_config.buffers;
  createMetaballsTex2D(context,5,0x1907,0x40,0x40,in_R9D);
  createQuadsTex2D(context,6,0x1907,0x40,0x40,in_R9D);
  (*context->_vptr_Context[5])(context,0,0,0x80,0x80);
  config = &(this->super_FboRenderCase).m_config;
  Functional::Framebuffer::Framebuffer(&fboA,context,config,0x80,0x80,0,0,0);
  Functional::Framebuffer::checkCompleteness(&fboA);
  uVar6._0_4_ = config->buffers;
  uVar6._4_4_ = config->colorType;
  uVar2._0_4_ = (this->super_FboRenderCase).m_config.colorFormat;
  uVar2._4_4_ = (this->super_FboRenderCase).m_config.depthStencilType;
  cfg.width = (this->super_FboRenderCase).m_config.width;
  cfg.height = (this->super_FboRenderCase).m_config.height;
  cfg.samples = (this->super_FboRenderCase).m_config.samples;
  cfg._0_8_ = uVar6 & 0xfffffffffffffaff;
  cfg._8_8_ = uVar2 & 0xffffffff;
  cfg.depthStencilFormat = 0;
  Functional::Framebuffer::Framebuffer(&fboB,context,&cfg,0x80,0x80,0,0,0);
  (*context->_vptr_Context[9])(context,0x8d40,(ulong)fboB.m_framebuffer);
  iVar4 = 2;
  while( true ) {
    while( true ) {
      do {
        iVar8 = iVar4 + -1;
        if (iVar4 == 0) {
          FboTestUtil::Texture2DShader::setUniforms(&texShader,context,program);
          (*context->_vptr_Context[0x2a])(0x3f800000,0,0,0x3f800000,context);
          (*context->_vptr_Context[0x2c])(context,1);
          (*context->_vptr_Context[0x2d])(context,0x4500);
          (*context->_vptr_Context[0x33])(context,0xb71);
          (*context->_vptr_Context[9])(context,0x8d40,(ulong)fboA.m_framebuffer);
          (*context->_vptr_Context[6])(context,0xde1,6);
          local_3e8.m_data[0] = -1.0;
          local_3e8.m_data[1] = -1.0;
          local_3e8.m_data._8_8_ = (ulong)(uint)local_3e8.m_data[3] << 0x20;
          local_3d0.m_data[0] = 1.0;
          local_3d0.m_data[1] = 1.0;
          local_3d0.m_data[2] = 0.0;
          sglr::drawQuad(context,program,(Vec3 *)&local_3e8,(Vec3 *)&local_3d0);
          if ((uVar5 >> 10 & 1) != 0) {
            (*context->_vptr_Context[0x33])(context,0xc11);
            (*context->_vptr_Context[0x32])(context,10,10,0xc,0x19);
            (*context->_vptr_Context[0x2c])(context,0);
            (*context->_vptr_Context[0x2d])(context,0x400);
            (*context->_vptr_Context[0x34])(context,0xc11);
          }
          (*context->_vptr_Context[9])(context,0x8d40,(ulong)fboB.m_framebuffer);
          (*context->_vptr_Context[6])(context,0xde1,5);
          local_3e8.m_data[0] = -1.0;
          local_3e8.m_data[1] = -1.0;
          local_3e8.m_data[2] = -1.0;
          local_3d0.m_data[0] = 1.0;
          local_3d0.m_data[1] = 1.0;
          local_3d0.m_data[2] = 1.0;
          sglr::drawQuad(context,program,(Vec3 *)&local_3e8,(Vec3 *)&local_3d0);
          (*context->_vptr_Context[0x34])(context,0xb71);
          if ((uVar5 >> 10 & 1) != 0) {
            (*context->_vptr_Context[0x33])(context,0xb90);
            (*context->_vptr_Context[0x35])(context,0x202,0,0xff);
            (*context->_vptr_Context[0x76])(context,(ulong)uVar3);
            local_3e8.m_data[0] = 0.0;
            local_3e8.m_data[1] = 1.0;
            local_3e8.m_data[2] = 0.0;
            local_3e8.m_data[3] = 1.0;
            FboTestUtil::FlatColorShader::setColor(&flatShader,context,uVar3,&local_3e8);
            local_3e8.m_data[0] = -1.0;
            local_3e8.m_data[1] = -1.0;
            local_3e8.m_data._8_8_ = local_3e8.m_data._8_8_ & 0xffffffff00000000;
            local_3d0.m_data[0] = 1.0;
            local_3d0.m_data[1] = 1.0;
            local_3d0.m_data[2] = 0.0;
            sglr::drawQuad(context,uVar3,(Vec3 *)&local_3e8,(Vec3 *)&local_3d0);
            (*context->_vptr_Context[0x34])(context,0xb90);
          }
          if ((this->super_FboRenderCase).m_config.colorType == 0xde1) {
            (*context->_vptr_Context[9])(context,0x8d40,0);
            uVar5 = (*context->_vptr_Context[2])(context);
            uVar3 = (*context->_vptr_Context[3])(context);
            (*context->_vptr_Context[5])(context,0,0,(ulong)uVar5,(ulong)uVar3);
            (*context->_vptr_Context[6])(context,0xde1,(ulong)fboA.m_colorBuffer);
            local_3e8.m_data[0] = -1.0;
            local_3e8.m_data[1] = -1.0;
            local_3e8.m_data._8_8_ = local_3e8.m_data._8_8_ & 0xffffffff00000000;
            local_3d0.m_data[0] = 0.0;
            local_3d0.m_data[1] = 1.0;
            local_3d0.m_data[2] = 0.0;
            sglr::drawQuad(context,program,(Vec3 *)&local_3e8,(Vec3 *)&local_3d0);
            (*context->_vptr_Context[6])(context,0xde1,(ulong)fboB.m_colorBuffer);
            local_3e8.m_data[0] = 0.0;
            local_3e8.m_data[1] = -1.0;
            local_3e8.m_data._8_8_ = local_3e8.m_data._8_8_ & 0xffffffff00000000;
            local_3d0.m_data[0] = 1.0;
            local_3d0.m_data[1] = 1.0;
            local_3d0.m_data[2] = 0.0;
            sglr::drawQuad(context,program,(Vec3 *)&local_3e8,(Vec3 *)&local_3d0);
            uVar5 = (*context->_vptr_Context[2])(context);
            uVar3 = (*context->_vptr_Context[3])(context);
            (*context->_vptr_Context[0x80])(context,local_3d8,0,0,(ulong)uVar5,(ulong)uVar3);
          }
          else {
            local_388 = glu::mapGLInternalFormat((this->super_FboRenderCase).m_config.colorFormat);
            tcu::Vector<float,_4>::Vector(&local_3e8,1.0);
            tcu::Vector<float,_4>::Vector(&local_3d0,0.0);
            FboTestUtil::readPixels
                      (context,local_3d8,0,0,0x80,0x80,&local_388,&local_3e8,&local_3d0);
          }
          Functional::Framebuffer::~Framebuffer(&fboB);
          Functional::Framebuffer::~Framebuffer(&fboA);
          sglr::ShaderProgram::~ShaderProgram(&flatShader.super_ShaderProgram);
          FboTestUtil::Texture2DShader::~Texture2DShader(&texShader);
          return;
        }
        bVar9 = iVar4 != 2;
        uVar7 = 0x400;
        if (!bVar9) {
          uVar7 = 0x100;
        }
        iVar4 = iVar8;
      } while ((config->buffers & uVar7) == 0);
      uVar6 = (ulong)((uint)bVar9 << 5 | 0x8d00);
      GVar1 = (this->super_FboRenderCase).m_config.depthStencilType;
      if (GVar1 != 0x8d41) break;
      (*context->_vptr_Context[0x20])(context,0x8d40,uVar6,0x8d41,(ulong)fboA.m_depthStencilBuffer);
    }
    if (GVar1 != 0xde1) break;
    (*context->_vptr_Context[0x1e])(context,0x8d40,uVar6,0xde1,(ulong)fboA.m_depthStencilBuffer,0);
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Not implemented",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFboRenderTest.cpp"
             ,0x386);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SharedDepthStencilTest::render (sglr::Context& context, Surface& dst)
{
	Texture2DShader	texShader		(DataTypes() << glu::TYPE_SAMPLER_2D, glu::TYPE_FLOAT_VEC4);
	FlatColorShader	flatShader		(glu::TYPE_FLOAT_VEC4);
	deUint32		texShaderID		= context.createProgram(&texShader);
	deUint32		flatShaderID	= context.createProgram(&flatShader);
	int				width			= 128;
	int				height			= 128;
//	bool			depth			= (m_config.buffers & GL_DEPTH_BUFFER_BIT) != 0;
	bool			stencil			= (m_config.buffers & GL_STENCIL_BUFFER_BIT) != 0;

	// Textures
	deUint32 metaballsTex	= 5;
	deUint32 quadsTex		= 6;
	createMetaballsTex2D(context, metaballsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);
	createQuadsTex2D(context, quadsTex, GL_RGB, GL_UNSIGNED_BYTE, 64, 64);

	context.viewport(0, 0, width, height);

	// Fbo A
	Framebuffer fboA(context, m_config, width, height);
	fboA.checkCompleteness();

	// Fbo B
	FboConfig cfg = m_config;
	cfg.buffers				&= ~(GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	cfg.depthStencilType	 = GL_NONE;
	cfg.depthStencilFormat	 = GL_NONE;
	Framebuffer fboB(context, cfg, width, height);

	// Bind depth/stencil buffers from fbo A to fbo B
	context.bindFramebuffer(GL_FRAMEBUFFER, fboB.getFramebuffer());
	for (int ndx = 0; ndx < 2; ndx++)
	{
		deUint32	bit		= ndx ? GL_STENCIL_BUFFER_BIT : GL_DEPTH_BUFFER_BIT;
		deUint32	point	= ndx ? GL_STENCIL_ATTACHMENT : GL_DEPTH_ATTACHMENT;

		if ((m_config.buffers & bit) == 0)
			continue;

		switch (m_config.depthStencilType)
		{
			case GL_TEXTURE_2D:		context.framebufferTexture2D(GL_FRAMEBUFFER, point, GL_TEXTURE_2D, fboA.getDepthStencilBuffer(), 0);	break;
			case GL_RENDERBUFFER:	context.framebufferRenderbuffer(GL_FRAMEBUFFER, point, GL_RENDERBUFFER, fboA.getDepthStencilBuffer());	break;
			default:
				TCU_FAIL("Not implemented");
		}
	}

	// Setup uniforms
	texShader.setUniforms(context, texShaderID);

	// Clear color to red and stencil to 1 in fbo B.
	context.clearColor(1.0f, 0.0f, 0.0f, 1.0f);
	context.clearStencil(1);
	context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

	context.enable(GL_DEPTH_TEST);

	// Render quad to fbo A
	context.bindFramebuffer(GL_FRAMEBUFFER, fboA.getFramebuffer());
	context.bindTexture(GL_TEXTURE_2D, quadsTex);
	sglr::drawQuad(context, texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

	if (stencil)
	{
		// Clear subset of stencil buffer to 0 in fbo A
		context.enable(GL_SCISSOR_TEST);
		context.scissor(10, 10, 12, 25);
		context.clearStencil(0);
		context.clear(GL_STENCIL_BUFFER_BIT);
		context.disable(GL_SCISSOR_TEST);
	}

	// Render metaballs to fbo B
	context.bindFramebuffer(GL_FRAMEBUFFER, fboB.getFramebuffer());
	context.bindTexture(GL_TEXTURE_2D, metaballsTex);
	sglr::drawQuad(context, texShaderID, Vec3(-1.0f, -1.0f, -1.0f), Vec3(1.0f, 1.0f, 1.0f));

	context.disable(GL_DEPTH_TEST);

	if (stencil)
	{
		// Render quad with stencil mask == 0
		context.enable(GL_STENCIL_TEST);
		context.stencilFunc(GL_EQUAL, 0, 0xffu);
		context.useProgram(flatShaderID);
		flatShader.setColor(context, flatShaderID, Vec4(0.0f, 1.0f, 0.0f, 1.0f));
		sglr::drawQuad(context, flatShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(+1.0f, +1.0f, 0.0f));
		context.disable(GL_STENCIL_TEST);
	}

	if (m_config.colorType == GL_TEXTURE_2D)
	{
		// Render both to screen
		context.bindFramebuffer(GL_FRAMEBUFFER, 0);
		context.viewport(0, 0, context.getWidth(), context.getHeight());
		context.bindTexture(GL_TEXTURE_2D, fboA.getColorBuffer());
		sglr::drawQuad(context, texShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(0.0f, 1.0f, 0.0f));
		context.bindTexture(GL_TEXTURE_2D, fboB.getColorBuffer());
		sglr::drawQuad(context, texShaderID, Vec3(0.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));

		context.readPixels(dst, 0, 0, context.getWidth(), context.getHeight());
	}
	else
	{
		// Read results from fbo B
		readPixels(context, dst, 0, 0, width, height, glu::mapGLInternalFormat(m_config.colorFormat), Vec4(1.0f), Vec4(0.0f));
	}
}